

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavefront.cpp
# Opt level: O2

int __thiscall WAVEFRONT::BuildMesh::GetIndex(BuildMesh *this,float *p,float *texCoord)

{
  FloatVector *this_00;
  pointer pfVar1;
  float *pfVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  float *pfVar6;
  
  pfVar1 = (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pfVar1) >> 2;
  iVar3 = (int)uVar4;
  iVar5 = (int)((long)((ulong)(uint)(iVar3 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / 3);
  if (2 < iVar3) {
    pfVar2 = texCoord;
    if (texCoord != (float *)0x0) {
      pfVar2 = (this->mTexCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    pfVar6 = pfVar1 + 2;
    for (iVar3 = 0; iVar5 != iVar3; iVar3 = iVar3 + 1) {
      if ((pfVar6[-2] == *p) && (!NAN(pfVar6[-2]) && !NAN(*p))) {
        if ((pfVar6[-1] == p[1]) && (!NAN(pfVar6[-1]) && !NAN(p[1]))) {
          if ((*pfVar6 == p[2]) && (!NAN(*pfVar6) && !NAN(p[2]))) {
            if (texCoord == (float *)0x0) {
              return iVar3;
            }
            if ((*pfVar2 == *texCoord) && (!NAN(*pfVar2) && !NAN(*texCoord))) {
              if ((pfVar2[1] == texCoord[1]) && (!NAN(pfVar2[1]) && !NAN(texCoord[1]))) {
                return iVar3;
              }
            }
          }
        }
      }
      if (pfVar2 != (float *)0x0) {
        pfVar2 = pfVar2 + 2;
      }
      pfVar6 = pfVar6 + 3;
    }
  }
  this_00 = &this->mVertices;
  std::vector<float,_std::allocator<float>_>::push_back(this_00,p);
  std::vector<float,_std::allocator<float>_>::push_back(this_00,p + 1);
  std::vector<float,_std::allocator<float>_>::push_back(this_00,p + 2);
  if (texCoord != (float *)0x0) {
    std::vector<float,_std::allocator<float>_>::push_back(&this->mTexCoords,texCoord);
    std::vector<float,_std::allocator<float>_>::push_back(&this->mTexCoords,texCoord + 1);
  }
  return iVar5;
}

Assistant:

int GetIndex(const float *p, const float *texCoord)
	{

		int vcount = (int)mVertices.size()/3;

		if(vcount>0)
		{
			//New MS STL library checks indices in debug build, so zero causes an assert if it is empty.
			const float *v = &mVertices[0];
			const float *t = texCoord != NULL ? &mTexCoords[0] : NULL;

			for (int i=0; i<vcount; i++)
			{
				if ( v[0] == p[0] && v[1] == p[1] && v[2] == p[2] )
				{
					if (texCoord == NULL || (t[0] == texCoord[0] && t[1] == texCoord[1]))
					{
						return i;
					}
				}
				v+=3;
				if (t != NULL)
					t += 2;
			}
		}

		mVertices.push_back( p[0] );
		mVertices.push_back( p[1] );
		mVertices.push_back( p[2] );

		if (texCoord != NULL)
		{
			mTexCoords.push_back( texCoord[0] );
			mTexCoords.push_back( texCoord[1] );
		}

		return vcount;
	}